

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_internal.h
# Opt level: O1

bool __thiscall bssl::Array<unsigned_char>::Init(Array<unsigned_char> *this,size_t new_size)

{
  size_t sVar1;
  uchar *puVar2;
  bool bVar3;
  size_t __len;
  size_t __n;
  
  bVar3 = InitUninitialized(this,new_size);
  if ((bVar3) && (sVar1 = this->size_, sVar1 != 0)) {
    puVar2 = this->data_;
    *puVar2 = '\0';
    __n = sVar1 - 1;
    if (__n != 0) {
      memset(puVar2 + 1,0,__n);
    }
  }
  return bVar3;
}

Assistant:

[[nodiscard]] bool Init(size_t new_size) {
    if (!InitUninitialized(new_size)) {
      return false;
    }
    std::uninitialized_value_construct_n(data_, size_);
    return true;
  }